

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FieldOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
    if ((int)from_msg[4]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 4),(RepeatedPtrFieldBase *)(from_msg + 4),
                 Arena::CopyConstruct<google::protobuf::FieldOptions_EditionDefault>);
    }
    if (*(int *)&from_msg[6]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[5]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[5]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::UninterpretedOption>);
    }
    uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((char)uVar1 == '\0') goto LAB_0025bb88;
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[7]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_0025bc2f;
      if ((MessageLite *)to_msg[7]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var4 = (_func_int **)Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        to_msg[7]._vptr_MessageLite = pp_Var4;
      }
      else {
        FeatureSet::MergeImpl((MessageLite *)to_msg[7]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[7]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_0025bc39;
      to_msg_00 = (MessageLite *)to_msg[7]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar5 = Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>(arena,pMVar2);
        to_msg[7]._internal_metadata_.ptr_ = (intptr_t)pvVar5;
      }
      else {
        FieldOptions_FeatureSupport::MergeImpl(to_msg_00,pMVar2);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(undefined4 *)&to_msg[8]._vptr_MessageLite = *(undefined4 *)&from_msg[8]._vptr_MessageLite;
    }
    if ((uVar1 & 8) != 0) {
      *(undefined1 *)((long)&to_msg[8]._vptr_MessageLite + 4) =
           *(undefined1 *)((long)&from_msg[8]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      *(undefined1 *)((long)&to_msg[8]._vptr_MessageLite + 5) =
           *(undefined1 *)((long)&from_msg[8]._vptr_MessageLite + 5);
    }
    if ((uVar1 & 0x20) != 0) {
      *(undefined1 *)((long)&to_msg[8]._vptr_MessageLite + 6) =
           *(undefined1 *)((long)&from_msg[8]._vptr_MessageLite + 6);
    }
    if ((uVar1 & 0x40) != 0) {
      *(undefined1 *)((long)&to_msg[8]._vptr_MessageLite + 7) =
           *(undefined1 *)((long)&from_msg[8]._vptr_MessageLite + 7);
    }
    if ((char)uVar1 < '\0') {
      *(int *)&to_msg[8]._internal_metadata_.ptr_ = (int)from_msg[8]._internal_metadata_.ptr_;
    }
LAB_0025bb88:
    if ((uVar1 & 0x700) != 0) {
      if ((uVar1 >> 8 & 1) != 0) {
        *(undefined1 *)((long)&to_msg[8]._internal_metadata_.ptr_ + 4) =
             *(undefined1 *)((long)&from_msg[8]._internal_metadata_.ptr_ + 4);
      }
      if ((uVar1 >> 9 & 1) != 0) {
        *(undefined1 *)((long)&to_msg[8]._internal_metadata_.ptr_ + 5) =
             *(undefined1 *)((long)&from_msg[8]._internal_metadata_.ptr_ + 5);
      }
      if ((uVar1 >> 10 & 1) != 0) {
        *(undefined4 *)&to_msg[9]._vptr_MessageLite = *(undefined4 *)&from_msg[9]._vptr_MessageLite;
      }
    }
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
    internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_FieldOptions_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar3 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar3 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
LAB_0025bc2f:
  MergeImpl((FieldOptions *)&stack0xffffffffffffffd0);
LAB_0025bc39:
  MergeImpl((FieldOptions *)&stack0xffffffffffffffd0);
}

Assistant:

void FieldOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldOptions*>(&to_msg);
  auto& from = static_cast<const FieldOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_targets()->MergeFrom(from._internal_targets());
  _this->_internal_mutable_edition_defaults()->MergeFrom(
      from._internal_edition_defaults());
  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.ctype_ = from._impl_.ctype_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.lazy_ = from._impl_.lazy_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.weak_ = from._impl_.weak_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.jstype_ = from._impl_.jstype_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.unverified_lazy_ = from._impl_.unverified_lazy_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.retention_ = from._impl_.retention_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}